

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

long __thiscall rapic::scan::get_header_integer(scan *this,char *name)

{
  long lVar1;
  runtime_error *this_00;
  header *p;
  allocator *__lhs;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  scan *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  header *local_18;
  
  local_18 = find_header(in_stack_ffffffffffffff98,
                         (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (local_18 != (header *)0x0) {
    lVar1 = header::get_integer((header *)0x11384d);
    return lVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  __lhs = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"missing mandatory header ",__lhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this_00);
  std::runtime_error::runtime_error(this_00,local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto scan::get_header_integer(char const* name) const -> long
{
  if (auto p = find_header(name))
    return p->get_integer();
  throw std::runtime_error{std::string("missing mandatory header ") + name};
}